

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O2

int64_t av1_block_error_c(tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz)

{
  int iVar1;
  int64_t iVar2;
  long lVar3;
  long lVar4;
  
  lVar3 = 0;
  if (block_size < 1) {
    block_size = lVar3;
  }
  iVar2 = 0;
  lVar4 = 0;
  for (; block_size != lVar3; lVar3 = lVar3 + 1) {
    iVar1 = coeff[lVar3];
    iVar2 = iVar2 + (ulong)(uint)((iVar1 - dqcoeff[lVar3]) * (iVar1 - dqcoeff[lVar3]));
    lVar4 = lVar4 + (ulong)(uint)(iVar1 * iVar1);
  }
  *ssz = lVar4;
  return iVar2;
}

Assistant:

int64_t av1_block_error_c(const tran_low_t *coeff, const tran_low_t *dqcoeff,
                          intptr_t block_size, int64_t *ssz) {
  int i;
  int64_t error = 0, sqcoeff = 0;

  for (i = 0; i < block_size; i++) {
    const int diff = coeff[i] - dqcoeff[i];
    error += diff * diff;
    sqcoeff += coeff[i] * coeff[i];
  }

  *ssz = sqcoeff;
  return error;
}